

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

bool __thiscall
wasm::OptimizeInstructions::areConsecutiveInputsEqual
          (OptimizeInstructions *this,Expression *left,Expression *right)

{
  bool bVar1;
  Expression *pEVar2;
  Expression *right_00;
  undefined1 local_2e8 [8];
  EffectAnalyzer originalRightEffects;
  EffectAnalyzer rightEffects;
  
  pEVar2 = Properties::getFallthrough
                     (left,&((this->
                             super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                             ).super_Pass.runner)->options,
                      (this->
                      super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                      ).
                      super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      .
                      super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      .currModule,NoTeeBrIf);
  bVar1 = areMatchingTeeAndGet(this,pEVar2,right);
  if (bVar1) {
    return true;
  }
  pEVar2 = getFallthrough(this,pEVar2);
  right_00 = getFallthrough(this,right);
  bVar1 = ExpressionAnalyzer::equal(pEVar2,right_00);
  if (bVar1) {
    if (right_00 != right) {
      effects((EffectAnalyzer *)local_2e8,this,right);
      effects((EffectAnalyzer *)
              &originalRightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count
              ,this,right_00);
      bVar1 = EffectAnalyzer::invalidates
                        ((EffectAnalyzer *)local_2e8,
                         (EffectAnalyzer *)
                         &originalRightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count);
      EffectAnalyzer::~EffectAnalyzer
                ((EffectAnalyzer *)
                 &originalRightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                  _M_node_count);
      EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_2e8);
      if (bVar1) goto LAB_00ade4a3;
    }
    bVar1 = Properties::isGenerative(pEVar2);
    bVar1 = !bVar1;
  }
  else {
LAB_00ade4a3:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool areConsecutiveInputsEqual(Expression* left, Expression* right) {
    // When we look for a tee/get pair, we can consider the fallthrough values
    // for the first, as the fallthrough happens last (however, we must use
    // NoTeeBrIf as we do not want to look through the tee). We cannot do this
    // on the second, however, as there could be effects in the middle.
    // TODO: Use effects here perhaps.
    left =
      Properties::getFallthrough(left,
                                 getPassOptions(),
                                 *getModule(),
                                 Properties::FallthroughBehavior::NoTeeBrIf);
    if (areMatchingTeeAndGet(left, right)) {
      return true;
    }

    // Ignore extraneous things and compare them syntactically. We can also
    // look at the full fallthrough for both sides now.
    left = getFallthrough(left);
    auto* originalRight = right;
    right = getFallthrough(right);
    if (!ExpressionAnalyzer::equal(left, right)) {
      return false;
    }

    // We must also not have non-fallthrough effects that invalidate us, such as
    // this situation:
    //
    //  (local.get $x)
    //  (block
    //    (local.set $x ..)
    //    (local.get $x)
    //  )
    //
    // The fallthroughs are identical, but the set may cause us to read a
    // different value.
    if (originalRight != right) {
      // TODO: We could be more precise here and ignore right itself in
      //       originalRightEffects.
      auto originalRightEffects = effects(originalRight);
      auto rightEffects = effects(right);
      if (originalRightEffects.invalidates(rightEffects)) {
        return false;
      }
    }

    // To be equal, they must also be known to return the same result
    // deterministically.
    return !Properties::isGenerative(left);
  }